

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8_fp16.h
# Opt level: O3

void ncnn::convdw3x3s1_fp16_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  long lVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  undefined1 (*pauVar36) [32];
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [32];
  undefined1 (*pauVar39) [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  
  iVar9 = bottom_blob->c;
  if (0 < (long)iVar9) {
    uVar10 = top_blob->w;
    iVar11 = top_blob->h;
    lVar35 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar46 = ZEXT3264(*(undefined1 (*) [32])(&_bias->data + lVar35 * 4));
      }
      pauVar38 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar35 * top_blob->elemsize + (long)top_blob->data);
      lVar29 = kernel->w * lVar35 * kernel->elemsize;
      pvVar12 = kernel->data;
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar29));
      auVar14 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar29 + 0x10));
      auVar15 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar29 + 0x20));
      auVar16 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar29 + 0x30));
      auVar17 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar29 + 0x40));
      auVar18 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar29 + 0x50));
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar29 + 0x60));
      auVar20 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar29 + 0x70));
      auVar21 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar29 + 0x80));
      if (0 < iVar11) {
        auVar22 = vcvtph2ps_f16c(auVar13);
        auVar23 = vcvtph2ps_f16c(auVar14);
        auVar24 = vcvtph2ps_f16c(auVar15);
        auVar43 = ZEXT3264(auVar24);
        auVar24 = vcvtph2ps_f16c(auVar16);
        auVar41 = ZEXT3264(auVar24);
        auVar24 = vcvtph2ps_f16c(auVar17);
        auVar25 = vcvtph2ps_f16c(auVar18);
        auVar26 = vcvtph2ps_f16c(auVar19);
        auVar27 = vcvtph2ps_f16c(auVar20);
        auVar28 = vcvtph2ps_f16c(auVar21);
        pauVar39 = (undefined1 (*) [32])
                   (bottom_blob->cstep * lVar35 * bottom_blob->elemsize + (long)bottom_blob->data);
        lVar29 = (long)bottom_blob->w * bottom_blob->elemsize;
        pauVar37 = (undefined1 (*) [32])(*pauVar39 + lVar29 * 2);
        pauVar36 = (undefined1 (*) [32])(*pauVar39 + lVar29);
        iVar30 = 0;
        auVar44 = auVar46._0_32_;
        do {
          if ((int)uVar10 < 8) {
            uVar33 = 0;
          }
          else {
            iVar31 = 7;
            auVar40 = auVar41._0_32_;
            auVar42 = auVar43._0_32_;
            do {
              auVar13 = vfmadd213ps_fma(*pauVar39,auVar22,auVar46._0_32_);
              auVar45 = pauVar39[1];
              auVar1 = pauVar39[2];
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar23,auVar45);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar1);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,*pauVar36);
              auVar2 = pauVar39[3];
              auVar3 = pauVar36[1];
              auVar4 = pauVar36[2];
              auVar5 = pauVar36[3];
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar24,auVar3);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar4);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,*pauVar37);
              auVar6 = pauVar37[1];
              auVar7 = pauVar37[2];
              auVar8 = pauVar37[3];
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar6);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar7);
              *pauVar38 = ZEXT1632(auVar13);
              auVar13 = vfmadd213ps_fma(auVar45,auVar22,auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar1,auVar23);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar2);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar3);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar4,auVar24);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar5);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar6);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar7);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar8);
              auVar45 = pauVar39[4];
              auVar3 = pauVar36[4];
              auVar6 = pauVar37[4];
              pauVar38[1] = ZEXT1632(auVar13);
              auVar13 = vfmadd213ps_fma(auVar1,auVar22,auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar2,auVar23);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar45);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar4);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar5,auVar24);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar3);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar7);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar8);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar6);
              auVar1 = pauVar39[5];
              auVar4 = pauVar36[5];
              auVar7 = pauVar37[5];
              pauVar38[2] = ZEXT1632(auVar13);
              auVar13 = vfmadd213ps_fma(auVar2,auVar22,auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar45,auVar23);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar1);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar5);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar3,auVar24);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar4);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar8);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar6);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar7);
              auVar2 = pauVar39[6];
              auVar5 = pauVar36[6];
              auVar8 = pauVar37[6];
              pauVar38[3] = ZEXT1632(auVar13);
              auVar13 = vfmadd213ps_fma(auVar45,auVar22,auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar1,auVar23);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar2);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar3);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar4,auVar24);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar5);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar6);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar7);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar8);
              auVar45 = pauVar39[7];
              auVar3 = pauVar36[7];
              auVar6 = pauVar37[7];
              pauVar38[4] = ZEXT1632(auVar13);
              auVar13 = vfmadd213ps_fma(auVar1,auVar22,auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar2,auVar23);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar45);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar4);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar5,auVar24);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar3);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar7);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar8);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar6);
              auVar1 = pauVar39[8];
              auVar4 = pauVar36[8];
              auVar7 = pauVar37[8];
              pauVar38[5] = ZEXT1632(auVar13);
              auVar46 = ZEXT3264(auVar44);
              auVar13 = vfmadd132ps_fma(auVar2,auVar44,auVar22);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar45,auVar23);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar1);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar5);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar24,auVar3);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar4);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar8);
              auVar13 = vfmadd213ps_fma(auVar45,auVar22,auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar1,auVar23);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,pauVar39[9]);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar3);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar24,auVar4);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar6);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,pauVar36[9]);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar6);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar7);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar7);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,pauVar37[9]);
              pauVar38[6] = ZEXT1632(auVar14);
              pauVar38[7] = ZEXT1632(auVar13);
              pauVar39 = pauVar39 + 8;
              pauVar36 = pauVar36 + 8;
              pauVar37 = pauVar37 + 8;
              pauVar38 = pauVar38 + 8;
              iVar31 = iVar31 + 8;
            } while (iVar31 < (int)uVar10);
            auVar43 = ZEXT3264(auVar42);
            auVar41 = ZEXT3264(auVar40);
            uVar33 = uVar10 & 0xfffffff8;
          }
          if ((int)(uVar33 | 3) < (int)uVar10) {
            auVar40 = auVar41._0_32_;
            auVar42 = auVar43._0_32_;
            lVar29 = 0;
            uVar32 = uVar33;
            do {
              lVar34 = lVar29;
              auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])(*pauVar39 + lVar34),auVar22,
                                        auVar46._0_32_);
              auVar45 = *(undefined1 (*) [32])(pauVar39[1] + lVar34);
              auVar1 = *(undefined1 (*) [32])(pauVar39[2] + lVar34);
              auVar2 = *(undefined1 (*) [32])(pauVar39[3] + lVar34);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar23,auVar45);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar1);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,
                                        *(undefined1 (*) [32])(*pauVar36 + lVar34));
              auVar3 = *(undefined1 (*) [32])(pauVar36[1] + lVar34);
              auVar4 = *(undefined1 (*) [32])(pauVar36[2] + lVar34);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar24,auVar3);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar4);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,
                                        *(undefined1 (*) [32])(*pauVar37 + lVar34));
              auVar5 = *(undefined1 (*) [32])(pauVar36[3] + lVar34);
              auVar6 = *(undefined1 (*) [32])(pauVar37[1] + lVar34);
              auVar7 = *(undefined1 (*) [32])(pauVar37[2] + lVar34);
              auVar8 = *(undefined1 (*) [32])(pauVar37[3] + lVar34);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar6);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar7);
              *(undefined1 (*) [32])((long)*pauVar38 + lVar34) = ZEXT1632(auVar13);
              auVar13 = vfmadd213ps_fma(auVar45,auVar22,auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar1,auVar23);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar2);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar3);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar4,auVar24);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar5);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar6);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar7);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar8);
              auVar45 = *(undefined1 (*) [32])(pauVar39[4] + lVar34);
              auVar3 = *(undefined1 (*) [32])(pauVar36[4] + lVar34);
              auVar6 = *(undefined1 (*) [32])(pauVar37[4] + lVar34);
              *(undefined1 (*) [32])(pauVar38[1] + lVar34) = ZEXT1632(auVar13);
              auVar13 = vfmadd213ps_fma(auVar1,auVar22,auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar2,auVar23);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,auVar45);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar4);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar5,auVar24);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar3);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar7);
              auVar13 = vfmadd213ps_fma(auVar2,auVar22,auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar23,auVar45);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,
                                        *(undefined1 (*) [32])(pauVar39[5] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,auVar5);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar3,auVar24);
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar8);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,
                                        *(undefined1 (*) [32])(pauVar36[5] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,auVar8);
              auVar46 = ZEXT3264(auVar44);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar6);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,
                                        *(undefined1 (*) [32])(pauVar37[5] + lVar34));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar6);
              *(undefined1 (*) [32])(pauVar38[2] + lVar34) = ZEXT1632(auVar14);
              *(undefined1 (*) [32])(pauVar38[3] + lVar34) = ZEXT1632(auVar13);
              uVar33 = uVar32 + 4;
              iVar31 = uVar32 + 7;
              lVar29 = lVar34 + 0x80;
              uVar32 = uVar33;
            } while (iVar31 < (int)uVar10);
            pauVar38 = (undefined1 (*) [32])(pauVar38[4] + lVar34);
            pauVar39 = (undefined1 (*) [32])(pauVar39[4] + lVar34);
            pauVar36 = (undefined1 (*) [32])(pauVar36[4] + lVar34);
            pauVar37 = (undefined1 (*) [32])(pauVar37[4] + lVar34);
            auVar43 = ZEXT3264(auVar42);
            auVar41 = ZEXT3264(auVar40);
          }
          auVar45 = auVar46._0_32_;
          auVar42 = auVar43._0_32_;
          auVar40 = auVar41._0_32_;
          if ((int)(uVar33 | 1) < (int)uVar10) {
            lVar29 = 0;
            uVar32 = uVar33;
            do {
              lVar34 = lVar29;
              auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])(*pauVar39 + lVar34),auVar22,auVar45);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar23,
                                        *(undefined1 (*) [32])(pauVar39[1] + lVar34));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,
                                        *(undefined1 (*) [32])(pauVar39[2] + lVar34));
              auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar39[1] + lVar34),auVar22,auVar45
                                       );
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar23,
                                        *(undefined1 (*) [32])(pauVar39[2] + lVar34));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar40,
                                        *(undefined1 (*) [32])(*pauVar36 + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,
                                        *(undefined1 (*) [32])(pauVar39[3] + lVar34));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar24,
                                        *(undefined1 (*) [32])(pauVar36[1] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,
                                        *(undefined1 (*) [32])(pauVar36[1] + lVar34));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar25,
                                        *(undefined1 (*) [32])(pauVar36[2] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar24,
                                        *(undefined1 (*) [32])(pauVar36[2] + lVar34));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,
                                        *(undefined1 (*) [32])(*pauVar37 + lVar34));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,
                                        *(undefined1 (*) [32])(pauVar37[1] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,
                                        *(undefined1 (*) [32])(pauVar36[3] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,
                                        *(undefined1 (*) [32])(pauVar37[1] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,
                                        *(undefined1 (*) [32])(pauVar37[2] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,
                                        *(undefined1 (*) [32])(pauVar37[3] + lVar34));
              auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,
                                        *(undefined1 (*) [32])(pauVar37[2] + lVar34));
              *(undefined1 (*) [32])((long)*pauVar38 + lVar34) = ZEXT1632(auVar14);
              *(undefined1 (*) [32])(pauVar38[1] + lVar34) = ZEXT1632(auVar13);
              uVar33 = uVar32 + 2;
              iVar31 = uVar32 + 3;
              lVar29 = lVar34 + 0x40;
              uVar32 = uVar33;
            } while (iVar31 < (int)uVar10);
            pauVar38 = (undefined1 (*) [32])(pauVar38[2] + lVar34);
            pauVar39 = (undefined1 (*) [32])(pauVar39[2] + lVar34);
            pauVar36 = (undefined1 (*) [32])(pauVar36[2] + lVar34);
            pauVar37 = (undefined1 (*) [32])(pauVar37[2] + lVar34);
          }
          iVar31 = uVar10 - uVar33;
          if (iVar31 != 0 && (int)uVar33 <= (int)uVar10) {
            lVar34 = 0x40;
            lVar29 = 0;
            do {
              auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar39[-2] + lVar34),auVar22,
                                        auVar45);
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar23,
                                        *(undefined1 (*) [32])(pauVar39[-1] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar42,
                                        *(undefined1 (*) [32])(*pauVar39 + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar40,
                                        *(undefined1 (*) [32])(pauVar36[-2] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar24,
                                        *(undefined1 (*) [32])(pauVar36[-1] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,
                                        *(undefined1 (*) [32])(*pauVar36 + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,
                                        *(undefined1 (*) [32])(pauVar37[-2] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,
                                        *(undefined1 (*) [32])(pauVar37[-1] + lVar34));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,
                                        *(undefined1 (*) [32])(*pauVar37 + lVar34));
              *(undefined1 (*) [32])(pauVar38[-2] + lVar34) = ZEXT1632(auVar13);
              lVar29 = lVar29 + -0x20;
              lVar34 = lVar34 + 0x20;
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
            pauVar38 = (undefined1 (*) [32])((long)pauVar38 - lVar29);
            pauVar39 = (undefined1 (*) [32])((long)pauVar39 - lVar29);
            pauVar36 = (undefined1 (*) [32])((long)pauVar36 - lVar29);
            pauVar37 = (undefined1 (*) [32])((long)pauVar37 - lVar29);
          }
          pauVar39 = pauVar39 + 2;
          pauVar36 = pauVar36 + 2;
          pauVar37 = pauVar37 + 2;
          iVar30 = iVar30 + 1;
        } while (iVar30 != iVar11);
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 != iVar9);
  }
  return;
}

Assistant:

static void convdw3x3s1_fp16_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const unsigned short* k0 = (const unsigned short*)kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = loadfp16(k0);
        __m256 _k01 = loadfp16(k0 + 8);
        __m256 _k02 = loadfp16(k0 + 16);
        __m256 _k10 = loadfp16(k0 + 24);
        __m256 _k11 = loadfp16(k0 + 32);
        __m256 _k12 = loadfp16(k0 + 40);
        __m256 _k20 = loadfp16(k0 + 48);
        __m256 _k21 = loadfp16(k0 + 56);
        __m256 _k22 = loadfp16(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                __m256 _sum4 = _bias0;
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 24, _sum3);

                _sum4 = _mm256_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k22, _r26, _sum4);

                __m256 _sum5 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                _mm256_storeu_ps(outptr0 + 32, _sum4);

                _sum5 = _mm256_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k22, _r27, _sum5);

                __m256 _sum6 = _bias0;
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 40, _sum5);

                _sum6 = _mm256_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k22, _r28, _sum6);

                __m256 _sum7 = _bias0;
                __m256 _r09 = _mm256_loadu_ps(r0 + 72);
                __m256 _r19 = _mm256_loadu_ps(r1 + 72);
                __m256 _r29 = _mm256_loadu_ps(r2 + 72);
                _mm256_storeu_ps(outptr0 + 48, _sum6);

                _sum7 = _mm256_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm256_storeu_ps(outptr0 + 56, _sum7);

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr0 += 64;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_storeu_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}